

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O2

int __thiscall
anon_unknown.dwarf_239414::AlsaCapture::open(AlsaCapture *this,char *__file,int __oflag,...)

{
  snd_pcm_t **ppsVar1;
  uint uVar2;
  ALCdevice *pAVar3;
  snd_pcm_t *psVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  code *pcVar7;
  snd_pcm_hw_params_t *psVar8;
  bool bVar9;
  int iVar10;
  ALuint AVar11;
  int iVar12;
  int extraout_EAX;
  pointer pcVar13;
  backend_exception *pbVar14;
  undefined8 uVar15;
  undefined4 uVar16;
  long lVar17;
  snd_pcm_uframes_t *psVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  long lVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  HwParamsPtr hp;
  snd_pcm_uframes_t periodSizeInFrames;
  snd_pcm_uframes_t bufferSizeInFrames;
  snd_pcm_hw_params_t *hp_1;
  
  if (__file == (char *)0x0) {
    pcVar13 = GetConfigValue((char *)0x0,"alsa","capture","default");
  }
  else {
    if ((anonymous_namespace)::CaptureDevices == DAT_002294d0) {
      probe_devices((vector<DevMap> *)&hp_1,SND_PCM_STREAM_CAPTURE);
      std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ::operator=((vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                   *)&(anonymous_namespace)::CaptureDevices,(vector<DevMap> *)&hp_1);
      std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ::~vector((vector<DevMap> *)&hp_1);
    }
    pbVar6 = DAT_002294d0;
    lVar20 = (long)DAT_002294d0 - (long)(anonymous_namespace)::CaptureDevices;
    __lhs = (anonymous_namespace)::CaptureDevices;
    for (lVar17 = lVar20 >> 8; pbVar19 = __lhs, 0 < lVar17; lVar17 = lVar17 + -1) {
      bVar9 = std::operator==(__lhs,__file);
      if (bVar9) goto LAB_0015ba69;
      bVar9 = std::operator==(__lhs + 2,__file);
      pbVar19 = __lhs + 2;
      if (bVar9) goto LAB_0015ba69;
      bVar9 = std::operator==(__lhs + 4,__file);
      pbVar19 = __lhs + 4;
      if (bVar9) goto LAB_0015ba69;
      bVar9 = std::operator==(__lhs + 6,__file);
      pbVar19 = __lhs + 6;
      if (bVar9) goto LAB_0015ba69;
      __lhs = __lhs + 8;
      lVar20 = lVar20 + -0x100;
    }
    lVar20 = lVar20 >> 6;
    if (lVar20 == 1) {
LAB_0015ba58:
      bVar9 = std::operator==(__lhs,__file);
      pbVar19 = pbVar6;
      if (bVar9) {
        pbVar19 = __lhs;
      }
    }
    else if (lVar20 == 2) {
LAB_0015ba34:
      bVar9 = std::operator==(pbVar19,__file);
      if (!bVar9) {
        __lhs = pbVar19 + 2;
        goto LAB_0015ba58;
      }
    }
    else {
      pbVar19 = pbVar6;
      if ((lVar20 == 3) && (bVar9 = std::operator==(__lhs,__file), pbVar19 = __lhs, !bVar9)) {
        pbVar19 = __lhs + 2;
        goto LAB_0015ba34;
      }
    }
LAB_0015ba69:
    if (pbVar19 == DAT_002294d0) {
      pbVar14 = (backend_exception *)__cxa_allocate_exception(0x30);
      al::backend_exception::backend_exception(pbVar14,0xa004,"Device name \"%s\" not found",__file)
      ;
      __cxa_throw(pbVar14,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
    }
    pcVar13 = pbVar19[1]._M_dataplus._M_p;
  }
  if (2 < (int)gLogLevel) {
    fprintf((FILE *)gLogFile,"[ALSOFT] (II) Opening device \"%s\"\n",pcVar13);
  }
  ppsVar1 = &this->mPcmHandle;
  iVar10 = (*(anonymous_namespace)::psnd_pcm_open)(ppsVar1,pcVar13,1);
  if (iVar10 < 0) {
    pbVar14 = (backend_exception *)__cxa_allocate_exception(0x30);
    al::backend_exception::backend_exception
              (pbVar14,0xa005,"Could not open ALSA device \"%s\"",pcVar13);
    __cxa_throw(pbVar14,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
  }
  (*(anonymous_namespace)::psnd_config_update_free_global)();
  pAVar3 = (this->super_BackendBase).mDevice;
  if ((ulong)pAVar3->FmtType < 7) {
    uVar16 = *(undefined4 *)(&DAT_0018af80 + (ulong)pAVar3->FmtType * 4);
  }
  else {
    uVar16 = 0xffffffff;
  }
  uVar2 = pAVar3->BufferSize;
  bufferSizeInFrames = (ulong)(pAVar3->Frequency * 100) / 1000;
  if ((uint)bufferSizeInFrames < uVar2) {
    bufferSizeInFrames = (snd_pcm_uframes_t)uVar2;
  }
  uVar5 = (ulong)(pAVar3->Frequency * 0x19);
  periodSizeInFrames = uVar5 / 1000;
  if (uVar2 < (uint)periodSizeInFrames) {
    periodSizeInFrames = (snd_pcm_uframes_t)uVar2;
  }
  hp_1 = (snd_pcm_hw_params_t *)0x0;
  (*(anonymous_namespace)::psnd_pcm_hw_params_malloc)(&hp_1,uVar2,uVar5 % 1000);
  psVar8 = hp_1;
  hp._M_t.super___uniq_ptr_impl<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter>._M_t.
  super__Tuple_impl<0UL,__snd_pcm_hw_params_*,_(anonymous_namespace)::HwParamsDeleter>.
  super__Head_base<0UL,__snd_pcm_hw_params_*,_false>._M_head_impl =
       (__uniq_ptr_data<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter,_true,_true>)
       (__uniq_ptr_data<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter,_true,_true>)hp_1
  ;
  iVar10 = (*(anonymous_namespace)::psnd_pcm_hw_params_any)(*ppsVar1,hp_1);
  if (iVar10 < 0) {
    pbVar14 = (backend_exception *)__cxa_allocate_exception(0x30);
    uVar15 = (*(anonymous_namespace)::psnd_strerror)(iVar10);
    al::backend_exception::backend_exception
              (pbVar14,0xa004,"snd_pcm_hw_params_any(mPcmHandle, hp.get()) failed: %s",uVar15);
  }
  else {
    iVar10 = (*(anonymous_namespace)::psnd_pcm_hw_params_set_access)(*ppsVar1,psVar8,3);
    if (iVar10 < 0) {
      pbVar14 = (backend_exception *)__cxa_allocate_exception(0x30);
      uVar15 = (*(anonymous_namespace)::psnd_strerror)(iVar10);
      al::backend_exception::backend_exception
                (pbVar14,0xa004,
                 "snd_pcm_hw_params_set_access(mPcmHandle, hp.get(), SND_PCM_ACCESS_RW_INTERLEAVED) failed: %s"
                 ,uVar15);
    }
    else {
      iVar10 = (*(anonymous_namespace)::psnd_pcm_hw_params_set_format)(*ppsVar1,psVar8,uVar16);
      pcVar7 = (anonymous_namespace)::psnd_pcm_hw_params_set_channels;
      if (iVar10 < 0) {
        pbVar14 = (backend_exception *)__cxa_allocate_exception(0x30);
        uVar15 = (*(anonymous_namespace)::psnd_strerror)(iVar10);
        al::backend_exception::backend_exception
                  (pbVar14,0xa004,
                   "snd_pcm_hw_params_set_format(mPcmHandle, hp.get(), format) failed: %s",uVar15);
      }
      else {
        psVar4 = this->mPcmHandle;
        AVar11 = ALCdevice::channelsFromFmt((this->super_BackendBase).mDevice);
        iVar10 = (*pcVar7)(psVar4,psVar8,AVar11);
        if (iVar10 < 0) {
          pbVar14 = (backend_exception *)__cxa_allocate_exception(0x30);
          uVar15 = (*(anonymous_namespace)::psnd_strerror)(iVar10);
          al::backend_exception::backend_exception
                    (pbVar14,0xa004,
                     "snd_pcm_hw_params_set_channels(mPcmHandle, hp.get(), mDevice->channelsFromFmt()) failed: %s"
                     ,uVar15);
        }
        else {
          iVar10 = (*(anonymous_namespace)::psnd_pcm_hw_params_set_rate)
                             (this->mPcmHandle,psVar8,((this->super_BackendBase).mDevice)->Frequency
                             );
          if (iVar10 < 0) {
            pbVar14 = (backend_exception *)__cxa_allocate_exception(0x30);
            uVar15 = (*(anonymous_namespace)::psnd_strerror)(iVar10);
            al::backend_exception::backend_exception
                      (pbVar14,0xa004,
                       "snd_pcm_hw_params_set_rate(mPcmHandle, hp.get(), mDevice->Frequency, 0) failed: %s"
                       ,uVar15);
          }
          else {
            iVar10 = (*(anonymous_namespace)::psnd_pcm_hw_params_set_buffer_size_min)
                               (*ppsVar1,psVar8,&bufferSizeInFrames);
            if (iVar10 < 0) {
              if (2 < (int)gLogLevel) {
                fwrite("[ALSOFT] (II) Buffer too large, using intermediate ring buffer\n",0x3f,1,
                       (FILE *)gLogFile);
              }
              iVar12 = (*(anonymous_namespace)::psnd_pcm_hw_params_set_buffer_size_near)
                                 (*ppsVar1,psVar8,&bufferSizeInFrames);
              if (iVar12 < 0) {
                pbVar14 = (backend_exception *)__cxa_allocate_exception(0x30);
                uVar15 = (*(anonymous_namespace)::psnd_strerror)(iVar12);
                al::backend_exception::backend_exception
                          (pbVar14,0xa004,
                           "snd_pcm_hw_params_set_buffer_size_near(mPcmHandle, hp.get(), &bufferSizeInFrames) failed: %s"
                           ,uVar15);
                goto LAB_0015bf16;
              }
            }
            iVar12 = (*(anonymous_namespace)::psnd_pcm_hw_params_set_period_size_near)
                               (*ppsVar1,psVar8,&periodSizeInFrames);
            if (iVar12 < 0) {
              pbVar14 = (backend_exception *)__cxa_allocate_exception(0x30);
              uVar15 = (*(anonymous_namespace)::psnd_strerror)(iVar12);
              al::backend_exception::backend_exception
                        (pbVar14,0xa004,
                         "snd_pcm_hw_params_set_period_size_near(mPcmHandle, hp.get(), &periodSizeInFrames, nullptr) failed: %s"
                         ,uVar15);
            }
            else {
              iVar12 = (*(anonymous_namespace)::psnd_pcm_hw_params)(*ppsVar1,psVar8);
              if (iVar12 < 0) {
                pbVar14 = (backend_exception *)__cxa_allocate_exception(0x30);
                uVar15 = (*(anonymous_namespace)::psnd_strerror)(iVar12);
                al::backend_exception::backend_exception
                          (pbVar14,0xa004,"snd_pcm_hw_params(mPcmHandle, hp.get()) failed: %s",
                           uVar15);
              }
              else {
                psVar18 = &periodSizeInFrames;
                iVar12 = (*(anonymous_namespace)::psnd_pcm_hw_params_get_period_size)
                                   (psVar8,psVar18,0);
                if (-1 < iVar12) {
                  std::unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter>::
                  operator=(&hp,psVar18);
                  if (iVar10 < 0) {
                    pAVar3 = (this->super_BackendBase).mDevice;
                    uVar2 = pAVar3->BufferSize;
                    AVar11 = ALCdevice::frameSizeFromFmt(pAVar3);
                    RingBuffer::Create((RingBuffer *)&hp_1,(ulong)uVar2,(ulong)AVar11,0);
                    psVar8 = hp_1;
                    hp_1 = (snd_pcm_hw_params_t *)0x0;
                    std::__uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>::reset
                              ((__uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_> *)
                               &this->mRing,(pointer)psVar8);
                    std::unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_>::~unique_ptr
                              ((unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)&hp_1);
                  }
                  std::__cxx11::string::assign
                            ((char *)&((this->super_BackendBase).mDevice)->DeviceName);
                  std::unique_ptr<_snd_pcm_hw_params,_(anonymous_namespace)::HwParamsDeleter>::
                  ~unique_ptr(&hp);
                  return extraout_EAX;
                }
                pbVar14 = (backend_exception *)__cxa_allocate_exception(0x30);
                uVar15 = (*(anonymous_namespace)::psnd_strerror)(iVar12);
                al::backend_exception::backend_exception
                          (pbVar14,0xa004,
                           "snd_pcm_hw_params_get_period_size(hp.get(), &periodSizeInFrames, nullptr) failed: %s"
                           ,uVar15);
              }
            }
          }
        }
      }
    }
  }
LAB_0015bf16:
  __cxa_throw(pbVar14,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
}

Assistant:

void AlsaCapture::open(const ALCchar *name)
{
    const char *driver{};
    if(name)
    {
        if(CaptureDevices.empty())
            CaptureDevices = probe_devices(SND_PCM_STREAM_CAPTURE);

        auto iter = std::find_if(CaptureDevices.cbegin(), CaptureDevices.cend(),
            [name](const DevMap &entry) -> bool
            { return entry.name == name; }
        );
        if(iter == CaptureDevices.cend())
            throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};
        driver = iter->device_name.c_str();
    }
    else
    {
        name = alsaDevice;
        driver = GetConfigValue(nullptr, "alsa", "capture", "default");
    }

    TRACE("Opening device \"%s\"\n", driver);
    int err{snd_pcm_open(&mPcmHandle, driver, SND_PCM_STREAM_CAPTURE, SND_PCM_NONBLOCK)};
    if(err < 0)
        throw al::backend_exception{ALC_OUT_OF_MEMORY, "Could not open ALSA device \"%s\"",
            driver};

    /* Free alsa's global config tree. Otherwise valgrind reports a ton of leaks. */
    snd_config_update_free_global();

    snd_pcm_format_t format{SND_PCM_FORMAT_UNKNOWN};
    switch(mDevice->FmtType)
    {
    case DevFmtByte:
        format = SND_PCM_FORMAT_S8;
        break;
    case DevFmtUByte:
        format = SND_PCM_FORMAT_U8;
        break;
    case DevFmtShort:
        format = SND_PCM_FORMAT_S16;
        break;
    case DevFmtUShort:
        format = SND_PCM_FORMAT_U16;
        break;
    case DevFmtInt:
        format = SND_PCM_FORMAT_S32;
        break;
    case DevFmtUInt:
        format = SND_PCM_FORMAT_U32;
        break;
    case DevFmtFloat:
        format = SND_PCM_FORMAT_FLOAT;
        break;
    }

    snd_pcm_uframes_t bufferSizeInFrames{maxu(mDevice->BufferSize, 100*mDevice->Frequency/1000)};
    snd_pcm_uframes_t periodSizeInFrames{minu(mDevice->BufferSize, 25*mDevice->Frequency/1000)};

    bool needring{false};
    HwParamsPtr hp{CreateHwParams()};
#define CHECK(x) do {                                                         \
    if((err=(x)) < 0)                                                         \
        throw al::backend_exception{ALC_INVALID_VALUE, #x " failed: %s", snd_strerror(err)}; \
} while(0)
    CHECK(snd_pcm_hw_params_any(mPcmHandle, hp.get()));
    /* set interleaved access */
    CHECK(snd_pcm_hw_params_set_access(mPcmHandle, hp.get(), SND_PCM_ACCESS_RW_INTERLEAVED));
    /* set format (implicitly sets sample bits) */
    CHECK(snd_pcm_hw_params_set_format(mPcmHandle, hp.get(), format));
    /* set channels (implicitly sets frame bits) */
    CHECK(snd_pcm_hw_params_set_channels(mPcmHandle, hp.get(), mDevice->channelsFromFmt()));
    /* set rate (implicitly constrains period/buffer parameters) */
    CHECK(snd_pcm_hw_params_set_rate(mPcmHandle, hp.get(), mDevice->Frequency, 0));
    /* set buffer size in frame units (implicitly sets period size/bytes/time and buffer time/bytes) */
    if(snd_pcm_hw_params_set_buffer_size_min(mPcmHandle, hp.get(), &bufferSizeInFrames) < 0)
    {
        TRACE("Buffer too large, using intermediate ring buffer\n");
        needring = true;
        CHECK(snd_pcm_hw_params_set_buffer_size_near(mPcmHandle, hp.get(), &bufferSizeInFrames));
    }
    /* set buffer size in frame units (implicitly sets period size/bytes/time and buffer time/bytes) */
    CHECK(snd_pcm_hw_params_set_period_size_near(mPcmHandle, hp.get(), &periodSizeInFrames, nullptr));
    /* install and prepare hardware configuration */
    CHECK(snd_pcm_hw_params(mPcmHandle, hp.get()));
    /* retrieve configuration info */
    CHECK(snd_pcm_hw_params_get_period_size(hp.get(), &periodSizeInFrames, nullptr));
#undef CHECK
    hp = nullptr;

    if(needring)
        mRing = RingBuffer::Create(mDevice->BufferSize, mDevice->frameSizeFromFmt(), false);

    mDevice->DeviceName = name;
}